

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O1

QString * __thiscall QLocale::nativeTerritoryName(QString *__return_storage_ptr__,QLocale *this)

{
  QLocaleData *pQVar1;
  Data *pDVar2;
  QSystemLocale *pQVar3;
  ulong size;
  long in_FS_OFFSET;
  anon_union_24_3_e3d07ef4_for_data local_68;
  undefined8 local_50;
  QVariant local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (((this->d).d.ptr)->m_data == &systemLocaleData) {
    (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    pQVar3 = systemLocale();
    local_68.shared = (PrivateShared *)0x0;
    local_68._8_8_ = 0;
    local_68._16_8_ = 0;
    local_50 = 2;
    (*pQVar3->_vptr_QSystemLocale[2])(&local_40,pQVar3,0x29);
    ::QVariant::toString(__return_storage_ptr__,&local_40);
    ::QVariant::~QVariant(&local_40);
    ::QVariant::~QVariant((QVariant *)&local_68);
    if ((__return_storage_ptr__->d).size != 0) goto LAB_0031c9c8;
    pDVar2 = (__return_storage_ptr__->d).d;
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&((__return_storage_ptr__->d).d)->super_QArrayData,2,0x10);
      }
    }
  }
  pQVar1 = ((this->d).d.ptr)->m_data;
  size = (ulong)pQVar1->m_endonymTerritory_size;
  if (size == 0) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    QString::fromRawData
              ((QChar *)(
                        L"АԥсшәаҚырҭтәылаQafarOtobbiaYabuutiEretriaAfrikaansSuid-AfrikaNamibiëAghemKàmàlûŋAkanGaanaAkooseKamerûnshqipShqipëriKosovëMaqedonia e Veriutአማርኛኢትዮጵያالعربيةمصرالجزائرالبحرينتشادجزر القمرجيبوتيإريترياالعراقإسرائيلالأردنالكويتلبنانليبياموريتانياالمغربعُمانالأراضي الفلسطينيةقطرالمملكة العربية السعوديةالصومالجنوب السودانالسودانسورياتونسالإمارات العربية المتحدةالصحراء الغربيةالعربية الفصحى الحديثةالعالماليمنaragonésEspanyaհայերենՀայաստանঅসমীয়াভাৰতasturianuEspañaKipareTadhaniaAtsamazərbaycanAzərbaycanتۆرکجهазәрбајҹанАзәрбајҹанrikpakamɛrúnbamanakanMaliবাংলাবাংলাদেশভারতƁàsàaKàmɛ̀rûnбашҡорт телеeuskaraEspainiaбеларускаяБеларусьIchibembaZambiaHibenaHutanzaniaभोजपुरीभारतብሊንኤርትራबर’bosanskiBosna i HercegovinaбосанскиБосна и ХерцеговинаbrezhonegFrañsбългарскиБългарияမြန်မာ粵語中國香港特別行政區粤语中华人民共和国catalàAndorraFrançaItàliaCebuanoPilipinasTamaziɣt n laṭlaṣMeṛṛukکوردیی ناوەندیعێراقئێران𑄌𑄋𑄴𑄟𑄳𑄦𑄝𑄁𑄣𑄘𑄬𑄌𑄴𑄞𑄢𑄧𑄖𑄴нохчийнРоссиᏣᎳᎩᏌᏊ ᎢᏳᎾᎵᏍᏔᏅ ᏍᎦᏚᎩChikashshanompaʼUnited StatesRukigaUganda简体中文中国中国香港特别行政区中国澳门特别行政区马来西亚新加坡繁體中文中國澳門特別行政區馬來西亞台灣церковнослове́нскїйрѡссі́ачӑвашРаҫҫейKölschDoütschlandkernewekRywvaneth UnyscorsuFranciahrvatskiHrvatskačeštinaČeskodanskDanmarkGrønlandދިވެހިބަސްދިވެހި ރާއްޖެडोगरीduáláCamerounNederlandsArubaVlaamsBelgiëCaribisch NederlandCuraçaoSint-MaartenSurinameརྫོང་ཁའབྲུགKĩembuKenyaAmerican English𐐀𐑍𐑊𐐮𐑇𐐏𐐭𐑌𐐴𐐻𐐲𐐼 𐐝𐐻𐐩𐐻𐑅American SamoaAnguillaAntigua & BarbudaAustralian EnglishAustriaBahamasBarbadosBelgiumBelizeBermudaBotswanaBritish Indian Ocean TerritoryBritish Virgin IslandsBurundiCameroonCanadian EnglishCanadaCayman IslandsChristmas IslandCocos (Keeling) IslandsCook IslandsCyprusDenmarkDiego GarciaDominicaEritreaEswatiniEuropeFalkland IslandsFijiFinlandGambiaGermanyGhanaGibraltarGrenadaGuamGuernseyGuyanaHong Kong SAR ChinaIndonesiaIrelandIsle of ManIsraelJamaicaJerseyKiribatiLesothoLiberiaMacao SAR ChinaMadagascarMalawiMalaysiaMaldivesMaltaMarshall IslandsMauritiusMicronesiaMontserratNamibiaNauruNetherlandsNew ZealandNigeriaNiueNorfolk IslandNorthern Mariana IslandsPakistanPalauPapua New GuineaP..." /* TRUNCATED STRING LITERAL */
                        + pQVar1->m_endonymTerritory_idx),size);
  }
LAB_0031c9c8:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QLocale::nativeTerritoryName() const
{
#ifndef QT_NO_SYSTEMLOCALE
    if (d->m_data == &systemLocaleData) {
        auto res = systemLocale()->query(QSystemLocale::NativeTerritoryName).toString();
        if (!res.isEmpty())
            return res;
    }
#endif
    return d->m_data->endonymTerritory().getData(endonyms_data);
}